

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O1

MapKeyComparator * __thiscall
google::protobuf::util::MessageDifferencer::GetMapKeyComparator
          (MessageDifferencer *this,FieldDescriptor *field)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _func_void_FieldDescriptor_ptr *local_28;
  FieldDescriptor *local_20;
  
  if (*(int *)(field + 0x3c) == 3) {
    p_Var1 = &(this->map_field_key_comparator_)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->map_field_key_comparator_)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent;
    p_Var4 = &p_Var1->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0;
        p_Var3 = (&p_Var3->_M_left)[*(FieldDescriptor **)(p_Var3 + 1) < field]) {
      if (*(FieldDescriptor **)(p_Var3 + 1) >= field) {
        p_Var4 = p_Var3;
      }
    }
    p_Var3 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       (p_Var3 = p_Var4, field < *(FieldDescriptor **)(p_Var4 + 1))) {
      p_Var3 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var3 == p_Var1) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_28 = FieldDescriptor::TypeOnceInit;
        local_20 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),&local_28,&local_20);
      }
      if (*(int *)(field + 0x38) == 0xb) {
        bVar2 = FieldDescriptor::is_map_message_type(field);
      }
      else {
        bVar2 = false;
      }
      p_Var3 = (_Base_ptr)0x0;
      if (bVar2 != false) {
        p_Var3 = (_Base_ptr)&this->map_entry_key_comparator_;
      }
    }
    else {
      p_Var3 = p_Var3[1]._M_parent;
    }
    return (MapKeyComparator *)p_Var3;
  }
  return (MapKeyComparator *)0x0;
}

Assistant:

inline bool FieldDescriptor::is_repeated() const {
  return label() == LABEL_REPEATED;
}